

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int ARKStepResize(void *arkode_mem,N_Vector y0,realtype hscale,realtype t0,ARKVecResizeFn resize,
                 void *resize_data)

{
  N_Vector tmpl;
  ARKVecResizeFn resize_00;
  sunindextype liw_diff;
  int iVar1;
  SUNNonlinearSolver NLS;
  char *msgfmt;
  long lVar2;
  int lrw_diff;
  int liw_diff_00;
  long lVar3;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype local_70;
  sunindextype local_6c;
  realtype local_68;
  void *local_60;
  N_Vector local_58;
  ARKVecResizeFn local_50;
  sunindextype local_44;
  ARKodeARKStepMem local_40;
  ARKodeMem local_38;
  
  local_68 = hscale;
  local_60 = (void *)t0;
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepResize",&local_38,&local_40);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_70 = 0;
  local_6c = 0;
  local_50 = resize;
  if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    N_VSpace(y0,&local_6c,&local_70);
  }
  resize_00 = local_50;
  lrw_diff = local_6c - local_38->lrw1;
  liw_diff_00 = local_70 - local_38->liw1;
  local_38->lrw1 = local_6c;
  local_38->liw1 = local_70;
  local_58 = y0;
  iVar1 = arkResize(local_38,y0,local_68,(realtype)local_60,local_50,resize_data);
  if (iVar1 == 0) {
    iVar1 = arkResizeVec(local_38,resize_00,resize_data,lrw_diff,liw_diff_00,local_58,
                         &local_40->sdata);
    if (((iVar1 == 0) ||
        (iVar1 = arkResizeVec(local_38,resize_00,resize_data,lrw_diff,liw_diff_00,local_58,
                              &local_40->zpred), tmpl = local_58, iVar1 == 0)) ||
       (local_44 = liw_diff_00,
       iVar1 = arkResizeVec(local_38,resize_00,resize_data,lrw_diff,liw_diff_00,local_58,
                            &local_40->zcor), liw_diff = local_44, iVar1 == 0)) {
LAB_004dd405:
      msgfmt = "Unable to resize vector";
    }
    else {
      local_68 = (realtype)CONCAT44(local_68._4_4_,lrw_diff);
      local_60 = resize_data;
      if ((local_40->Fe != (N_Vector *)0x0) && (0 < local_40->stages)) {
        lVar3 = 0;
        lVar2 = 0;
        do {
          iVar1 = arkResizeVec(local_38,local_50,local_60,local_68._0_4_,liw_diff,tmpl,
                               (N_Vector *)((long)local_40->Fe + lVar3));
          if (iVar1 == 0) goto LAB_004dd405;
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 8;
        } while (lVar2 < local_40->stages);
      }
      if ((local_40->Fi != (N_Vector *)0x0) && (0 < local_40->stages)) {
        lVar3 = 0;
        lVar2 = 0;
        do {
          iVar1 = arkResizeVec(local_38,local_50,local_60,local_68._0_4_,liw_diff,tmpl,
                               (N_Vector *)((long)local_40->Fi + lVar3));
          if (iVar1 == 0) goto LAB_004dd405;
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 8;
        } while (lVar2 < local_40->stages);
      }
      if ((local_40->NLS == (SUNNonlinearSolver)0x0) || (local_40->ownNLS == 0)) {
LAB_004dd462:
        if (local_40->NLS == (SUNNonlinearSolver)0x0) {
          return 0;
        }
        local_40->nsetups = 0;
        return 0;
      }
      iVar1 = SUNNonlinSolFree(local_40->NLS);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_40->NLS = (SUNNonlinearSolver)0x0;
      local_40->ownNLS = 0;
      NLS = SUNNonlinSol_Newton(tmpl,local_38->sunctx);
      if (NLS == (SUNNonlinearSolver)0x0) {
        msgfmt = "Error creating default Newton solver";
      }
      else {
        iVar1 = ARKStepSetNonlinearSolver(local_38,NLS);
        if (iVar1 == 0) {
          local_40->ownNLS = 1;
          goto LAB_004dd462;
        }
        msgfmt = "Error attaching default Newton solver";
      }
    }
    iVar1 = -0x14;
  }
  else {
    msgfmt = "Unable to resize main ARKode infrastructure";
  }
  arkProcessError(local_38,iVar1,"ARKode::ARKStep","ARKStepResize",msgfmt);
  return iVar1;
}

Assistant:

int ARKStepResize(void *arkode_mem, N_Vector y0, realtype hscale,
                  realtype t0, ARKVecResizeFn resize, void *resize_data)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int i, retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepResize",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL)
    N_VSpace(y0, &lrw1, &liw1);
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* resize ARKode infrastructure memory */
  retval = arkResize(ark_mem, y0, hscale, t0, resize, resize_data);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize main ARKode infrastructure");
    return(retval);
  }

  /* Resize the sdata, zpred and zcor vectors */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->sdata)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->zpred)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &step_mem->zcor)) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                    "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  /* Resize the ARKStep vectors */
  /*     Fe */
  if (step_mem->Fe != NULL) {
    for (i=0; i<step_mem->stages; i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &step_mem->Fe[i])) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                        "Unable to resize vector");
        return(ARK_MEM_FAIL);
      }
    }
  }
  /*     Fi */
  if (step_mem->Fi != NULL) {
    for (i=0; i<step_mem->stages; i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &step_mem->Fi[i])) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep", "ARKStepResize",
                        "Unable to resize vector");
        return(ARK_MEM_FAIL);
      }
    }
  }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {

    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS)  return(retval);
    step_mem->NLS = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep",
                      "ARKStepResize", "Error creating default Newton solver");
      return(ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object to ARKStep */
    retval = ARKStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::ARKStep",
                      "ARKStepResize", "Error attaching default Newton solver");
      return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;

  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL)  step_mem->nsetups = 0;

  return(ARK_SUCCESS);
}